

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O1

void __thiscall XipFile::FileEntry::tostream(FileEntry *this,XipFile *xip,ReadWriter_ptr *w)

{
  ReadWriter_ptr r;
  shared_ptr<ReadWriter> local_30;
  ReadWriter *local_20;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_18;
  
  (*(this->super_XipEntry)._vptr_XipEntry[6])(&local_20,this,xip);
  local_30.super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (w->super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_30.super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (w->super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if (local_30.super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_30.super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_30.super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_30.super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_30.super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  ReadWriter::copyto<std::shared_ptr<ReadWriter>>(local_20,&local_30);
  if (local_30.super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_30.super___shared_ptr<ReadWriter,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
              );
  }
  if (local_18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_18);
  }
  return;
}

Assistant:

virtual void tostream(XipFile& xip, ReadWriter_ptr w)
        {
            ReadWriter_ptr r= getdatareader(xip);

            r->copyto(w);
        }